

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void pythonCharacters(void *user_data,xmlChar *ch,int len)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = "characters";
  iVar1 = PyObject_HasAttrString(user_data,"characters");
  if (iVar1 == 0) {
    pcVar4 = "data";
    iVar1 = PyObject_HasAttrString(user_data,"data");
    if (iVar1 == 0) {
      return;
    }
  }
  plVar2 = (long *)_PyObject_CallMethod_SizeT(user_data,pcVar4,"s#",ch,(long)len);
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    PyErr_Print();
  }
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc(plVar2);
    return;
  }
  return;
}

Assistant:

static void
pythonCharacters(void *user_data, const xmlChar * ch, int len)
{
    PyObject *handler;
    PyObject *result = NULL;
    int type = 0;

#ifdef DEBUG_SAX
    printf("pythonCharacters(%s, %d) called\n", ch, len);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "characters"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "data"))
        type = 2;
    if (type != 0) {
        if (type == 1)
            result = PyObject_CallMethod(handler, (char *) "characters",
                                         (char *) "s#", ch, (Py_ssize_t)len);
        else if (type == 2)
            result = PyObject_CallMethod(handler, (char *) "data",
                                         (char *) "s#", ch, (Py_ssize_t)len);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}